

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void row_mt_frame_init(AV1Decoder *pbi,int tile_rows_start,int tile_rows_end,int tile_cols_start,
                      int tile_cols_end,int start_tile,int end_tile,int max_sb_rows)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  TileInfo *tile_info;
  TileDataDec *tile_data;
  int tile_col;
  int tile_row;
  AV1DecRowMTInfo *frame_row_mt_info;
  AV1_COMMON *cm;
  AV1_COMMON *in_stack_ffffffffffffffa8;
  int local_38;
  int local_34;
  
  *(int *)(in_RDI + 0x5f6f0) = in_ESI;
  *(int *)(in_RDI + 0x5f6f4) = in_EDX;
  *(int *)(in_RDI + 0x5f6f8) = in_ECX;
  *(int *)(in_RDI + 0x5f6fc) = in_R8D;
  *(int *)(in_RDI + 0x5f700) = in_R9D;
  *(int *)(in_RDI + 0x5f704) = in_stack_00000008;
  *(undefined4 *)(in_RDI + 0x5f708) = 0;
  *(undefined4 *)(in_RDI + 0x5f70c) = 0;
  *(undefined4 *)(in_RDI + 0x5f710) = 0;
  *(undefined4 *)(in_RDI + 0x5f714) = 0;
  for (local_34 = in_ESI; local_38 = in_ECX, local_34 < in_EDX; local_34 = local_34 + 1) {
    for (; local_38 < in_R8D; local_38 = local_38 + 1) {
      if ((in_R9D <= local_34 * *(int *)(in_RDI + 0x9c00) + local_38) &&
         (local_34 * *(int *)(in_RDI + 0x9c00) + local_38 <= in_stack_00000008)) {
        piVar2 = (int *)(*(long *)(in_RDI + 0x48d20) +
                         (long)(local_34 * *(int *)(in_RDI + 0x9c00)) * 0x53a0 +
                        (long)local_38 * 0x53a0);
        piVar2[0x14e4] = 0;
        piVar2[0x14e5] = 0;
        piVar2[0x14e6] = 0;
        piVar2[0x14e2] =
             (piVar2[1] - *piVar2) +
             (1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f)) + -1 &
             ((1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f)) - 1U ^
             0xffffffff);
        piVar2[0x14e3] =
             (piVar2[3] - piVar2[2]) +
             (1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f)) + -1 &
             ((1 << ((byte)*(undefined4 *)(*(long *)(in_RDI + 0x9be8) + 0x24) & 0x1f)) - 1U ^
             0xffffffff);
        iVar1 = av1_get_intrabc_extra_top_right_sb_delay(in_stack_ffffffffffffffa8);
        piVar2[0x14e1] = iVar1;
        *(int *)(in_RDI + 0x5f708) = piVar2[0x14e2] + *(int *)(in_RDI + 0x5f708);
        memset(*(void **)(piVar2 + 0x14de),0xff,(long)(int)tile_info << 2);
      }
    }
  }
  if (*(long *)(in_RDI + 0x5f6e0) == 0) {
    pvVar3 = aom_malloc(0x1b149b);
    *(void **)(in_RDI + 0x5f6e0) = pvVar3;
    if (*(long *)(in_RDI + 0x5f6e0) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->row_mt_mutex_");
    }
    if (*(long *)(in_RDI + 0x5f6e0) != 0) {
      pthread_mutex_init(*(pthread_mutex_t **)(in_RDI + 0x5f6e0),(pthread_mutexattr_t *)0x0);
    }
  }
  if (*(long *)(in_RDI + 0x5f6e8) == 0) {
    pvVar3 = aom_malloc(0x1b1518);
    *(void **)(in_RDI + 0x5f6e8) = pvVar3;
    if (*(long *)(in_RDI + 0x5f6e8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x3b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->row_mt_cond_");
    }
    if (*(long *)(in_RDI + 0x5f6e8) != 0) {
      pthread_cond_init(*(pthread_cond_t **)(in_RDI + 0x5f6e8),(pthread_condattr_t *)0x0);
    }
  }
  return;
}

Assistant:

static inline void row_mt_frame_init(AV1Decoder *pbi, int tile_rows_start,
                                     int tile_rows_end, int tile_cols_start,
                                     int tile_cols_end, int start_tile,
                                     int end_tile, int max_sb_rows) {
  AV1_COMMON *const cm = &pbi->common;
  AV1DecRowMTInfo *frame_row_mt_info = &pbi->frame_row_mt_info;

  frame_row_mt_info->tile_rows_start = tile_rows_start;
  frame_row_mt_info->tile_rows_end = tile_rows_end;
  frame_row_mt_info->tile_cols_start = tile_cols_start;
  frame_row_mt_info->tile_cols_end = tile_cols_end;
  frame_row_mt_info->start_tile = start_tile;
  frame_row_mt_info->end_tile = end_tile;
  frame_row_mt_info->mi_rows_to_decode = 0;
  frame_row_mt_info->mi_rows_parse_done = 0;
  frame_row_mt_info->mi_rows_decode_started = 0;
  frame_row_mt_info->row_mt_exit = 0;

  for (int tile_row = tile_rows_start; tile_row < tile_rows_end; ++tile_row) {
    for (int tile_col = tile_cols_start; tile_col < tile_cols_end; ++tile_col) {
      if (tile_row * cm->tiles.cols + tile_col < start_tile ||
          tile_row * cm->tiles.cols + tile_col > end_tile)
        continue;

      TileDataDec *const tile_data =
          pbi->tile_data + tile_row * cm->tiles.cols + tile_col;
      const TileInfo *const tile_info = &tile_data->tile_info;

      tile_data->dec_row_mt_sync.mi_rows_parse_done = 0;
      tile_data->dec_row_mt_sync.mi_rows_decode_started = 0;
      tile_data->dec_row_mt_sync.num_threads_working = 0;
      tile_data->dec_row_mt_sync.mi_rows =
          ALIGN_POWER_OF_TWO(tile_info->mi_row_end - tile_info->mi_row_start,
                             cm->seq_params->mib_size_log2);
      tile_data->dec_row_mt_sync.mi_cols =
          ALIGN_POWER_OF_TWO(tile_info->mi_col_end - tile_info->mi_col_start,
                             cm->seq_params->mib_size_log2);
      tile_data->dec_row_mt_sync.intrabc_extra_top_right_sb_delay =
          av1_get_intrabc_extra_top_right_sb_delay(cm);

      frame_row_mt_info->mi_rows_to_decode +=
          tile_data->dec_row_mt_sync.mi_rows;

      // Initialize cur_sb_col to -1 for all SB rows.
      memset(tile_data->dec_row_mt_sync.cur_sb_col, -1,
             sizeof(*tile_data->dec_row_mt_sync.cur_sb_col) * max_sb_rows);
    }
  }

#if CONFIG_MULTITHREAD
  if (pbi->row_mt_mutex_ == NULL) {
    CHECK_MEM_ERROR(cm, pbi->row_mt_mutex_,
                    aom_malloc(sizeof(*(pbi->row_mt_mutex_))));
    if (pbi->row_mt_mutex_) {
      pthread_mutex_init(pbi->row_mt_mutex_, NULL);
    }
  }

  if (pbi->row_mt_cond_ == NULL) {
    CHECK_MEM_ERROR(cm, pbi->row_mt_cond_,
                    aom_malloc(sizeof(*(pbi->row_mt_cond_))));
    if (pbi->row_mt_cond_) {
      pthread_cond_init(pbi->row_mt_cond_, NULL);
    }
  }
#endif
}